

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

size_t quicly_encodev_capacity(uint64_t v)

{
  uint64_t v_local;
  undefined8 local_8;
  
  if (v < 0x40) {
    local_8 = 1;
  }
  else if (v < 0x4000) {
    local_8 = 2;
  }
  else if (v < 0x40000000) {
    local_8 = 4;
  }
  else {
    local_8 = 8;
  }
  return local_8;
}

Assistant:

inline size_t quicly_encodev_capacity(uint64_t v)
{
    if (v > 63) {
        if (v > 16383) {
            if (v > 1073741823)
                return 8;
            return 4;
        }
        return 2;
    }
    return 1;
}